

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.h
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::GetStateBlock(ChElementBeamIGA *this,ChVectorDynamic<> *mD)

{
  pointer psVar1;
  long lVar2;
  double *pdVar3;
  element_type *peVar4;
  long lVar5;
  Index index;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)(((ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x700000000) >>
             0x20);
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
  if (lVar5 != 0) {
    lVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar3 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar5 = lVar5 >> 4;
    lVar7 = 0;
    pdVar8 = pdVar3;
    do {
      if (lVar2 + -3 < lVar7 * 7) goto LAB_0068eead;
      uVar6 = 3;
      peVar4 = psVar1[lVar7].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar9 = -((uint)((ulong)(pdVar3 + lVar7 * 7) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 3) {
          uVar6 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_0068edfb;
      }
      else {
LAB_0068edfb:
        uVar10 = 0;
        do {
          pdVar8[uVar10] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar10 * 8 + 0x20);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      if (uVar6 < 3) {
        do {
          pdVar8[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar6 * 8 + 0x20);
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      if (lVar2 + -4 < lVar7 * 7 + 3) {
LAB_0068eead:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar6 = 4;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar9 = -((uint)((ulong)(pdVar3 + lVar7 * 7 + 3) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar9 < 4) {
          uVar6 = (ulong)uVar9;
        }
        if (uVar9 != 0) goto LAB_0068ee5f;
      }
      else {
LAB_0068ee5f:
        uVar10 = 0;
        do {
          pdVar8[uVar10 + 3] = *(double *)((long)&peVar4->field_0x38 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      if (uVar6 < 4) {
        do {
          pdVar8[uVar6 + 3] = *(double *)((long)&peVar4->field_0x38 + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (uVar6 != 4);
      }
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 7;
    } while (lVar7 != lVar5 + (ulong)(lVar5 == 0));
  }
  return;
}

Assistant:

virtual void GetStateBlock(ChVectorDynamic<>& mD) override {
        mD.resize((int)this->nodes.size() * 7);

        for (int i = 0; i < nodes.size(); ++i) {
            mD.segment(i * 7 + 0, 3) = nodes[i]->coord.pos.eigen();
            mD.segment(i * 7 + 3, 4) = nodes[i]->coord.rot.eigen();
        }
    }